

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::write_decimal<unsigned__int128>
          (basic_writer<fmt::v6::buffer_range<char>> *this,unsigned___int128 value)

{
  undefined8 *puVar1;
  long lVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  byte bVar5;
  long lVar6;
  ulong in_RDX;
  uint uVar7;
  undefined1 *puVar8;
  ulong in_RSI;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  basic_writer<fmt::v6::buffer_range<char>> *in_stack_ffffffffffffff68;
  long lVar13;
  char *in_stack_ffffffffffffff70;
  undefined1 local_88 [88];
  
  auVar3._8_8_ = in_RDX;
  auVar3._0_8_ = in_RSI;
  uVar7 = 1;
  if ((in_RSI < 10) <= in_RDX) {
    uVar4 = 4;
    auVar12 = auVar3;
    do {
      uVar7 = uVar4;
      uVar9 = auVar12._8_8_;
      uVar10 = auVar12._0_8_;
      in_stack_ffffffffffffff68 = this;
      if (uVar9 == 0 && (ulong)(99 < uVar10) <= -uVar9) {
        uVar7 = uVar7 - 2;
        goto LAB_0014112d;
      }
      if (uVar9 == 0 && (ulong)(999 < uVar10) <= -uVar9) {
        uVar7 = uVar7 - 1;
        goto LAB_0014112d;
      }
      if (uVar9 < (uVar10 < 10000)) goto LAB_0014112d;
      auVar12 = __udivti3(uVar10,uVar9,10000,0);
      uVar4 = uVar7 + 4;
    } while (uVar9 != 0 || -uVar9 < (ulong)(99999 < uVar10));
    uVar7 = uVar7 + 1;
    in_stack_ffffffffffffff68 = this;
  }
LAB_0014112d:
  puVar1 = *(undefined8 **)this;
  lVar13 = puVar1[2];
  uVar10 = (int)uVar7 + lVar13;
  if ((ulong)puVar1[3] < uVar10) {
    (**(code **)*puVar1)(puVar1,uVar10);
  }
  puVar1[2] = uVar10;
  if ((int)uVar7 < 0) {
    assert_fail(in_stack_ffffffffffffff70,0,(char *)in_stack_ffffffffffffff68);
  }
  lVar2 = puVar1[1];
  uVar10 = (ulong)uVar7;
  puVar8 = local_88 + uVar10;
  auVar12 = auVar3;
  if ((in_RSI < 100) <= in_RDX) {
    do {
      lVar6 = auVar3._8_8_;
      uVar11 = auVar3._0_8_;
      auVar12 = __udivti3(uVar11,lVar6,100,0);
      uVar9 = (ulong)(uint)(auVar3._0_4_ + auVar12._0_4_ * -100);
      puVar8[-1] = basic_data<void>::digits[(uVar9 * 2 & 0xffffffff) + 1];
      puVar8[-2] = basic_data<void>::digits[uVar9 * 2];
      puVar8 = puVar8 + -2;
      auVar3 = auVar12;
    } while (lVar6 != 0 || (ulong)-lVar6 < (ulong)(9999 < uVar11));
  }
  if (auVar12._8_8_ == 0 && (ulong)(9 < auVar12._0_8_) <= (ulong)-auVar12._8_8_) {
    bVar5 = auVar12[0] | 0x30;
    lVar6 = -1;
  }
  else {
    uVar9 = auVar12._0_8_ * 2;
    puVar8[-1] = basic_data<void>::digits[(uVar9 & 0xffffffff) + 1];
    bVar5 = basic_data<void>::digits[uVar9 & 0x1fffffffe];
    lVar6 = -2;
  }
  puVar8[lVar6] = bVar5;
  memcpy((void *)(lVar2 + lVar13),local_88,uVar10);
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }